

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

void __thiscall
icu_63::UnicodeSetStringSpan::UnicodeSetStringSpan
          (UnicodeSetStringSpan *this,UnicodeSet *set,UVector *setStrings,uint32_t which)

{
  UnicodeSet *this_00;
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint8_t uVar4;
  char cVar5;
  int32_t iVar6;
  int iVar7;
  int32_t iVar8;
  void *pvVar9;
  int32_t *piVar10;
  undefined1 uVar11;
  UChar *s;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint8_t *dest;
  UErrorCode errorCode;
  int32_t local_78;
  UErrorCode local_74;
  UChar *local_70;
  long local_68;
  int local_5c;
  UnicodeSet *local_58;
  int32_t *local_50;
  int32_t *local_48;
  int32_t *local_40;
  int32_t **local_38;
  
  this_00 = &this->spanSet;
  UnicodeSet::UnicodeSet(this_00,0,0x10ffff);
  this->pSpanNotSet = (UnicodeSet *)0x0;
  this->strings = setStrings;
  this->utf8Lengths = (int32_t *)0x0;
  this->spanLengths = (uint8_t *)0x0;
  this->utf8 = (uint8_t *)0x0;
  this->utf8Length = 0;
  this->maxLength16 = 0;
  this->maxLength8 = 0;
  this->all = which == 0x3f;
  local_58 = this_00;
  UnicodeSet::retainAll(this_00,set);
  if ((which & 1) != 0) {
    this->pSpanNotSet = local_58;
  }
  local_68 = (long)this->strings->count;
  if (local_68 < 1) goto LAB_002dce9c;
  local_38 = &this->utf8Lengths;
  uVar15 = 0;
  bVar3 = false;
  do {
    pvVar9 = UVector::elementAt(this->strings,uVar15);
    uVar1 = *(ushort *)((long)pvVar9 + 8);
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        s = *(UChar **)((long)pvVar9 + 0x18);
      }
      else {
        s = (UChar *)((long)pvVar9 + 10);
      }
    }
    else {
      s = (UChar *)0x0;
    }
    if ((short)uVar1 < 0) {
      iVar8 = *(int32_t *)((long)pvVar9 + 0xc);
    }
    else {
      iVar8 = (int)(short)uVar1 >> 5;
    }
    iVar6 = UnicodeSet::span(local_58,s,iVar8,USET_SPAN_CONTAINED);
    if (iVar6 < iVar8) {
      bVar3 = true;
    }
    if (((which & 8) != 0) && (this->maxLength16 < iVar8)) {
      this->maxLength16 = iVar8;
    }
    if (((which & 4) != 0) && ((which & 2) != 0 || iVar6 < iVar8)) {
      local_74 = U_ZERO_ERROR;
      local_78 = 0;
      u_strToUTF8_63((char *)0x0,0,&local_78,s,iVar8,&local_74);
      iVar7 = 0;
      if (local_74 == U_BUFFER_OVERFLOW_ERROR) {
        iVar7 = local_78;
      }
      if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar7 = local_78;
      }
      this->utf8Length = this->utf8Length + iVar7;
      if (this->maxLength8 < iVar7) {
        this->maxLength8 = iVar7;
      }
    }
    lVar14 = local_68;
    uVar15 = uVar15 + 1;
    uVar13 = (uint)local_68;
  } while (uVar13 != uVar15);
  if (!bVar3) goto LAB_002dce9c;
  if (this->all == '\0') {
LAB_002dce22:
    if ((which & 4) == 0) {
      cVar5 = '\0';
      uVar15 = uVar13;
    }
    else {
      uVar15 = uVar13 * 5 + this->utf8Length;
      cVar5 = '\0';
    }
  }
  else {
    UnicodeSet::freeze(local_58);
    cVar5 = this->all;
    if (cVar5 == '\0') goto LAB_002dce22;
    uVar15 = uVar13 * 8 + this->utf8Length;
  }
  if ((int)uVar15 < 0x81) {
    piVar10 = this->staticLengths;
    this->utf8Lengths = piVar10;
  }
  else {
    piVar10 = (int32_t *)uprv_malloc_63((ulong)uVar15);
    *local_38 = piVar10;
    if (piVar10 == (int32_t *)0x0) {
LAB_002dce9c:
      this->maxLength16 = 0;
      this->maxLength8 = 0;
      return;
    }
    cVar5 = this->all;
  }
  if (cVar5 == '\0') {
    if ((which & 4) != 0) {
      piVar10 = piVar10 + lVar14;
      this->utf8 = (uint8_t *)((long)piVar10 + lVar14);
    }
    this->spanLengths = (uint8_t *)piVar10;
    local_50 = piVar10;
    local_48 = piVar10;
  }
  else {
    this->spanLengths = (uint8_t *)(piVar10 + lVar14);
    local_48 = (int32_t *)((long)(piVar10 + lVar14) + lVar14);
    local_50 = (int32_t *)((long)local_48 + lVar14);
    piVar10 = (int32_t *)((long)local_50 + lVar14);
    this->utf8 = (uint8_t *)((long)piVar10 + lVar14);
  }
  if (0 < (int)uVar13) {
    lVar14 = 0;
    local_5c = 0;
    local_40 = piVar10;
    do {
      pvVar9 = UVector::elementAt(this->strings,(int32_t)lVar14);
      uVar1 = *(ushort *)((long)pvVar9 + 8);
      if ((uVar1 & 0x11) == 0) {
        if ((uVar1 & 2) == 0) {
          local_70 = *(UChar **)((long)pvVar9 + 0x18);
        }
        else {
          local_70 = (UChar *)((long)pvVar9 + 10);
        }
      }
      else {
        local_70 = (UChar *)0x0;
      }
      if ((short)uVar1 < 0) {
        uVar15 = *(uint *)((long)pvVar9 + 0xc);
      }
      else {
        uVar15 = (int)(short)uVar1 >> 5;
      }
      iVar8 = UnicodeSet::span(local_58,local_70,uVar15,USET_SPAN_CONTAINED);
      if (iVar8 < (int)uVar15) {
        if ((which & 8) != 0) {
          if ((which & 2) == 0) {
            *(undefined1 *)((long)local_48 + lVar14) = 0;
            uVar11 = 0;
            piVar10 = (int32_t *)this->spanLengths;
          }
          else {
            if ((which & 0x20) != 0) {
              uVar4 = (uint8_t)iVar8;
              if (0xfd < iVar8) {
                uVar4 = 0xfe;
              }
              this->spanLengths[lVar14] = uVar4;
            }
            if ((which & 0x10) == 0) goto LAB_002dcfe7;
            iVar8 = UnicodeSet::spanBack(local_58,local_70,uVar15,USET_SPAN_CONTAINED);
            iVar7 = uVar15 - iVar8;
            if (0xfd < (int)(uVar15 - iVar8)) {
              iVar7 = 0xfe;
            }
            uVar11 = (undefined1)iVar7;
            piVar10 = local_48;
          }
          *(undefined1 *)((long)piVar10 + lVar14) = uVar11;
        }
LAB_002dcfe7:
        if ((which & 4) != 0) {
          dest = this->utf8 + local_5c;
          local_74 = U_ZERO_ERROR;
          local_78 = 0;
          u_strToUTF8_63((char *)dest,this->utf8Length - local_5c,&local_78,local_70,uVar15,
                         &local_74);
          iVar7 = 0;
          if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
            iVar7 = local_78;
          }
          (*local_38)[lVar14] = iVar7;
          local_5c = local_5c + iVar7;
          piVar10 = local_50;
          if (iVar7 == 0) {
            *(undefined1 *)((long)local_40 + lVar14) = 0xff;
            uVar11 = 0xff;
          }
          else if ((which & 2) == 0) {
            *(undefined1 *)((long)local_40 + lVar14) = 0;
            uVar11 = 0;
          }
          else {
            if ((which & 0x20) != 0) {
              iVar8 = UnicodeSet::spanUTF8(local_58,(char *)dest,iVar7,USET_SPAN_CONTAINED);
              uVar11 = (undefined1)iVar8;
              if (0xfd < iVar8) {
                uVar11 = 0xfe;
              }
              *(undefined1 *)((long)local_50 + lVar14) = uVar11;
            }
            if ((which & 0x10) == 0) goto LAB_002dd109;
            iVar8 = UnicodeSet::spanBackUTF8(local_58,(char *)dest,iVar7,USET_SPAN_CONTAINED);
            iVar2 = iVar7 - iVar8;
            if (0xfd < iVar7 - iVar8) {
              iVar2 = 0xfe;
            }
            uVar11 = (undefined1)iVar2;
            piVar10 = local_40;
          }
          *(undefined1 *)((long)piVar10 + lVar14) = uVar11;
        }
LAB_002dd109:
        lVar12 = local_68;
        if ((which & 1) != 0) {
          if ((which & 0x20) != 0) {
            uVar13 = (uint)(ushort)*local_70;
            if (((uVar15 != 1) && ((uVar13 & 0xfc00) == 0xd800)) &&
               (((ushort)local_70[1] & 0xfc00) == 0xdc00)) {
              uVar13 = (uint)(ushort)*local_70 * 0x400 + (uint)(ushort)local_70[1] + 0xfca02400;
            }
            addToSpanNotSet(this,uVar13);
          }
          lVar12 = local_68;
          if ((which & 0x10) != 0) {
            uVar13 = (uint)(ushort)local_70[(long)(int)uVar15 + -1];
            if (((1 < (int)uVar15) && ((uVar13 & 0xfc00) == 0xdc00)) &&
               ((local_70[(ulong)uVar15 - 2] & 0xfc00U) == 0xd800)) {
              uVar13 = (uint)(ushort)local_70[(long)(int)uVar15 + -1] +
                       (uint)(ushort)local_70[(ulong)uVar15 - 2] * 0x400 + 0xfca02400;
            }
            addToSpanNotSet(this,uVar13);
          }
        }
      }
      else {
        if ((which & 4) != 0) {
          if ((which & 2) == 0) {
            (*local_38)[lVar14] = 0;
          }
          else {
            local_74 = U_ZERO_ERROR;
            local_78 = 0;
            u_strToUTF8_63((char *)(this->utf8 + local_5c),this->utf8Length - local_5c,&local_78,
                           local_70,uVar15,&local_74);
            iVar7 = 0;
            if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
              iVar7 = local_78;
            }
            (*local_38)[lVar14] = iVar7;
            local_5c = local_5c + iVar7;
          }
        }
        if (this->all != '\0') {
          *(undefined1 *)((long)local_40 + lVar14) = 0xff;
          *(undefined1 *)((long)local_50 + lVar14) = 0xff;
          *(undefined1 *)((long)local_48 + lVar14) = 0xff;
        }
        this->spanLengths[lVar14] = 0xff;
        lVar12 = local_68;
      }
      lVar14 = lVar14 + 1;
    } while (lVar12 != lVar14);
    cVar5 = this->all;
  }
  if (cVar5 == '\0') {
    return;
  }
  UnicodeSet::freeze(this->pSpanNotSet);
  return;
}

Assistant:

UnicodeSetStringSpan::UnicodeSetStringSpan(const UnicodeSet &set,
                                           const UVector &setStrings,
                                           uint32_t which)
        : spanSet(0, 0x10ffff), pSpanNotSet(NULL), strings(setStrings),
          utf8Lengths(NULL), spanLengths(NULL), utf8(NULL),
          utf8Length(0),
          maxLength16(0), maxLength8(0),
          all((UBool)(which==ALL)) {
    spanSet.retainAll(set);
    if(which&NOT_CONTAINED) {
        // Default to the same sets.
        // addToSpanNotSet() will create a separate set if necessary.
        pSpanNotSet=&spanSet;
    }

    // Determine if the strings even need to be taken into account at all for span() etc.
    // If any string is relevant, then all strings need to be used for
    // span(longest match) but only the relevant ones for span(while contained).
    // TODO: Possible optimization: Distinguish CONTAINED vs. LONGEST_MATCH
    //   and do not store UTF-8 strings if !thisRelevant and CONTAINED.
    //   (Only store irrelevant UTF-8 strings for LONGEST_MATCH where they are relevant after all.)
    // Also count the lengths of the UTF-8 versions of the strings for memory allocation.
    int32_t stringsLength=strings.size();

    int32_t i, spanLength;
    UBool someRelevant=FALSE;
    for(i=0; i<stringsLength; ++i) {
        const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
        const UChar *s16=string.getBuffer();
        int32_t length16=string.length();
        UBool thisRelevant;
        spanLength=spanSet.span(s16, length16, USET_SPAN_CONTAINED);
        if(spanLength<length16) {  // Relevant string.
            someRelevant=thisRelevant=TRUE;
        } else {
            thisRelevant=FALSE;
        }
        if((which&UTF16) && length16>maxLength16) {
            maxLength16=length16;
        }
        if((which&UTF8) && (thisRelevant || (which&CONTAINED))) {
            int32_t length8=getUTF8Length(s16, length16);
            utf8Length+=length8;
            if(length8>maxLength8) {
                maxLength8=length8;
            }
        }
    }
    if(!someRelevant) {
        maxLength16=maxLength8=0;
        return;
    }

    // Freeze after checking for the need to use strings at all because freezing
    // a set takes some time and memory which are wasted if there are no relevant strings.
    if(all) {
        spanSet.freeze();
    }

    uint8_t *spanBackLengths;
    uint8_t *spanUTF8Lengths;
    uint8_t *spanBackUTF8Lengths;

    // Allocate a block of meta data.
    int32_t allocSize;
    if(all) {
        // UTF-8 lengths, 4 sets of span lengths, UTF-8 strings.
        allocSize=stringsLength*(4+1+1+1+1)+utf8Length;
    } else {
        allocSize=stringsLength;  // One set of span lengths.
        if(which&UTF8) {
            // UTF-8 lengths and UTF-8 strings.
            allocSize+=stringsLength*4+utf8Length;
        }
    }
    if(allocSize<=(int32_t)sizeof(staticLengths)) {
        utf8Lengths=staticLengths;
    } else {
        utf8Lengths=(int32_t *)uprv_malloc(allocSize);
        if(utf8Lengths==NULL) {
            maxLength16=maxLength8=0;  // Prevent usage by making needsStringSpanUTF16/8() return FALSE.
            return;  // Out of memory.
        }
    }

    if(all) {
        // Store span lengths for all span() variants.
        spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
        spanBackLengths=spanLengths+stringsLength;
        spanUTF8Lengths=spanBackLengths+stringsLength;
        spanBackUTF8Lengths=spanUTF8Lengths+stringsLength;
        utf8=spanBackUTF8Lengths+stringsLength;
    } else {
        // Store span lengths for only one span() variant.
        if(which&UTF8) {
            spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
            utf8=spanLengths+stringsLength;
        } else {
            spanLengths=(uint8_t *)utf8Lengths;
        }
        spanBackLengths=spanUTF8Lengths=spanBackUTF8Lengths=spanLengths;
    }

    // Set the meta data and pSpanNotSet and write the UTF-8 strings.
    int32_t utf8Count=0;  // Count UTF-8 bytes written so far.

    for(i=0; i<stringsLength; ++i) {
        const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
        const UChar *s16=string.getBuffer();
        int32_t length16=string.length();
        spanLength=spanSet.span(s16, length16, USET_SPAN_CONTAINED);
        if(spanLength<length16) {  // Relevant string.
            if(which&UTF16) {
                if(which&CONTAINED) {
                    if(which&FWD) {
                        spanLengths[i]=makeSpanLengthByte(spanLength);
                    }
                    if(which&BACK) {
                        spanLength=length16-spanSet.spanBack(s16, length16, USET_SPAN_CONTAINED);
                        spanBackLengths[i]=makeSpanLengthByte(spanLength);
                    }
                } else /* not CONTAINED, not all, but NOT_CONTAINED */ {
                    spanLengths[i]=spanBackLengths[i]=0;  // Only store a relevant/irrelevant flag.
                }
            }
            if(which&UTF8) {
                uint8_t *s8=utf8+utf8Count;
                int32_t length8=appendUTF8(s16, length16, s8, utf8Length-utf8Count);
                utf8Count+=utf8Lengths[i]=length8;
                if(length8==0) {  // Irrelevant for UTF-8 because not representable in UTF-8.
                    spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=(uint8_t)ALL_CP_CONTAINED;
                } else {  // Relevant for UTF-8.
                    if(which&CONTAINED) {
                        if(which&FWD) {
                            spanLength=spanSet.spanUTF8((const char *)s8, length8, USET_SPAN_CONTAINED);
                            spanUTF8Lengths[i]=makeSpanLengthByte(spanLength);
                        }
                        if(which&BACK) {
                            spanLength=length8-spanSet.spanBackUTF8((const char *)s8, length8, USET_SPAN_CONTAINED);
                            spanBackUTF8Lengths[i]=makeSpanLengthByte(spanLength);
                        }
                    } else /* not CONTAINED, not all, but NOT_CONTAINED */ {
                        spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=0;  // Only store a relevant/irrelevant flag.
                    }
                }
            }
            if(which&NOT_CONTAINED) {
                // Add string start and end code points to the spanNotSet so that
                // a span(while not contained) stops before any string.
                UChar32 c;
                if(which&FWD) {
                    int32_t len=0;
                    U16_NEXT(s16, len, length16, c);
                    addToSpanNotSet(c);
                }
                if(which&BACK) {
                    int32_t len=length16;
                    U16_PREV(s16, 0, len, c);
                    addToSpanNotSet(c);
                }
            }
        } else {  // Irrelevant string.
            if(which&UTF8) {
                if(which&CONTAINED) {  // Only necessary for LONGEST_MATCH.
                    uint8_t *s8=utf8+utf8Count;
                    int32_t length8=appendUTF8(s16, length16, s8, utf8Length-utf8Count);
                    utf8Count+=utf8Lengths[i]=length8;
                } else {
                    utf8Lengths[i]=0;
                }
            }
            if(all) {
                spanLengths[i]=spanBackLengths[i]=
                    spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=
                        (uint8_t)ALL_CP_CONTAINED;
            } else {
                // All spanXYZLengths pointers contain the same address.
                spanLengths[i]=(uint8_t)ALL_CP_CONTAINED;
            }
        }
    }

    // Finish.
    if(all) {
        pSpanNotSet->freeze();
    }
}